

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineInterface.hpp
# Opt level: O2

void __thiscall supermap::cli::CommandLineInterface::Handler::~Handler(Handler *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Handler() = default;